

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)70,(moira::Mode)5,(moira::Size)2>(Moira *this,u16 op)

{
  bool bVar1;
  uint uVar2;
  ushort in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int src;
  u32 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  u32 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = in_SI & 7;
  bVar1 = readOp<(moira::Mode)5,(moira::Size)2,128ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  if (bVar1) {
    prefetch<0ul>(in_RDI);
    shift<(moira::Instr)70,(moira::Size)2>
              ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),
               in_stack_ffffffffffffffec,(u64)in_RDI);
    writeM<(moira::Mode)5,(moira::Size)2,4ul>
              (in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}